

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_predict_lbd_c(int16_t *ac_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3,int width,
                      int height)

{
  uint8_t uVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int i;
  int j;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_24 = 0; local_24 < in_R9D; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
      iVar2 = get_scaled_luma_q0(in_ECX,*(int16_t *)(local_8 + (long)local_28 * 2));
      uVar1 = clip_pixel(iVar2 + (uint)*(byte *)(local_10 + local_28));
      *(uint8_t *)(local_10 + local_28) = uVar1;
    }
    local_10 = local_10 + in_EDX;
    local_8 = local_8 + 0x40;
  }
  return;
}

Assistant:

static inline void cfl_predict_lbd_c(const int16_t *ac_buf_q3, uint8_t *dst,
                                     int dst_stride, int alpha_q3, int width,
                                     int height) {
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      dst[i] = clip_pixel(get_scaled_luma_q0(alpha_q3, ac_buf_q3[i]) + dst[i]);
    }
    dst += dst_stride;
    ac_buf_q3 += CFL_BUF_LINE;
  }
}